

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O2

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  char cVar2;
  int iVar3;
  pointer pRVar4;
  ulong uVar5;
  pointer pRVar6;
  Enum EVar7;
  undefined1 auVar8 [8];
  char *pcVar9;
  iterator iter;
  undefined1 auVar10 [8];
  OffsetRange OVar11;
  undefined1 local_68 [8];
  vector<char,_std::allocator<char>_> buffer;
  long local_40;
  Offset buffer_file_offset;
  Offset line_offset;
  undefined4 extraout_var;
  
  if ((ulong)(long)find_line <
      (ulong)((long)(this->line_ranges_).
                    super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->line_ranges_).
                    super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    OVar11 = GetCachedLine(this,find_line);
    *out_range = OVar11;
    EVar7 = Ok;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68,0x10000,(allocator_type *)&local_40);
    pRVar6 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar4 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar6 == pRVar4) {
      __assert_fail("!line_ranges_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/lexer-source-line-finder.cc"
                    ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
    }
    local_40 = 0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&this->line_ranges_;
    while ((ulong)((long)pRVar4 - (long)pRVar6 >> 4) <= (ulong)(long)find_line) {
      if (this->eof_ != false) {
LAB_00d98da7:
        EVar7 = Error;
        goto LAB_00d98dc4;
      }
      _Var1._M_head_impl =
           (this->source_)._M_t.
           super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
           super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
           super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
      iVar3 = (*(_Var1._M_head_impl)->_vptr_LexerSource[3])(_Var1._M_head_impl,&local_40);
      if (iVar3 == 1) goto LAB_00d98da7;
      _Var1._M_head_impl =
           (this->source_)._M_t.
           super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
           super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
           super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
      iVar3 = (*(_Var1._M_head_impl)->_vptr_LexerSource[4])
                        (_Var1._M_head_impl,local_68,
                         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start - (long)local_68);
      uVar5 = CONCAT44(extraout_var,iVar3);
      if (uVar5 < (ulong)((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start - (long)local_68)) {
        this->eof_ = true;
      }
      pcVar9 = (char *)((long)local_68 + uVar5);
      auVar8 = local_68;
      for (auVar10 = local_68; (ulong)auVar10 < pcVar9;
          auVar10 = (undefined1  [8])((long)auVar10 + 1)) {
        cVar2 = *(char *)auVar10;
        if (cVar2 == '\n') {
          buffer_file_offset = (long)auVar8 + ((local_40 - (long)local_68) - (ulong)this->last_cr_);
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&this->next_line_start_,
                     &buffer_file_offset);
          this->next_line_start_ = buffer_file_offset + this->last_cr_ + 1;
          cVar2 = *(char *)auVar10;
        }
        this->last_cr_ = cVar2 == '\r';
        auVar8 = (undefined1  [8])((long)auVar8 + 1);
      }
      if (this->eof_ != false) {
        buffer_file_offset = local_40 + uVar5;
        std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,&this->next_line_start_,
                   &buffer_file_offset);
      }
      pRVar6 = (this->line_ranges_).
               super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 = (this->line_ranges_).
               super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    OVar11 = GetCachedLine(this,find_line);
    *out_range = OVar11;
    EVar7 = Ok;
LAB_00d98dc4:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_68);
  }
  return (Result)EVar7;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}